

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O1

void del_light_source(level *lev,int type,void *id)

{
  ls_t **pplVar1;
  long lVar2;
  void *pvVar3;
  ls_t *plVar4;
  ls_t *plVar5;
  ls_t *__ptr;
  void *pvVar6;
  
  if (type == 0) {
    lVar2 = 0x18;
  }
  else {
    if (type != 1) {
      pvVar3 = (void *)0x0;
      goto LAB_001b3054;
    }
    lVar2 = 0x28;
  }
  pvVar3 = (void *)(ulong)*(uint *)((long)id + lVar2);
LAB_001b3054:
  if (lev->lev_lights != (ls_t *)0x0) {
    plVar5 = (ls_t *)0x0;
    __ptr = lev->lev_lights;
    do {
      if (__ptr->type == type) {
        pvVar6 = pvVar3;
        if ((__ptr->flags & 2) == 0) {
          pvVar6 = id;
        }
        if (__ptr->id == pvVar6) {
          plVar4 = (ls_t *)&lev->lev_lights;
          if (plVar5 != (ls_t *)0x0) {
            plVar4 = plVar5;
          }
          plVar4->next = __ptr->next;
          free(__ptr);
          vision_full_recalc = '\x01';
          return;
        }
      }
      pplVar1 = &__ptr->next;
      plVar5 = __ptr;
      __ptr = *pplVar1;
    } while (*pplVar1 != (ls_t *)0x0);
  }
  return;
}

Assistant:

void del_light_source(struct level *lev, int type, void *id)
{
    light_source *curr, *prev;
    long tmp_id;

    /* need to be prepared for dealing a with light source which
       has only been partially restored during a level change
       (in particular: chameleon vs prot. from shape changers) */
    switch (type) {
    case LS_OBJECT:	tmp_id = (((struct obj *)id)->o_id);
			break;
    case LS_MONSTER:	tmp_id = (((struct monst *)id)->m_id);
			break;
    default:		tmp_id = 0;
			break;
    }

    for (prev = 0, curr = lev->lev_lights; curr; prev = curr, curr = curr->next) {
	if (curr->type != type) continue;
	if (curr->id == ((curr->flags & LSF_NEEDS_FIXUP) ? (void*)tmp_id : id)) {
	    if (prev)
		prev->next = curr->next;
	    else
		lev->lev_lights = curr->next;

	    free(curr);
	    vision_full_recalc = 1;
	    return;
	}
    }
}